

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_VileChase
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *self;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *__assertion;
  bool bVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = (AActor *)(param->field_0).field_1.a;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (self->super_DThinker).super_DObject.Class;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f452e;
        }
      }
      bVar4 = P_CheckForResurrection(self,true);
      if (!bVar4) {
        A_DoChase(self,false,self->MeleeState,self->MissileState,true,gameinfo.nightmarefast,false,0
                 );
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f452e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xb88,
                "int AF_AActor_A_VileChase(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_VileChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (!P_CheckForResurrection(self, true))
	{
		A_DoChase(self, false, self->MeleeState, self->MissileState, true, gameinfo.nightmarefast, false, 0);
	}
	return 0;
}